

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

int __thiscall
cmsys::SystemInformationImplementation::GetProcessorCacheXSize
          (SystemInformationImplementation *this,long dwCacheID)

{
  int iVar1;
  
  if (dwCacheID == 0x20000) {
    iVar1 = (this->Features).L3CacheSize;
  }
  else {
    if (dwCacheID == 0x10000) {
      return (this->Features).L2CacheSize;
    }
    iVar1 = -1;
    if (dwCacheID == 0x8000) {
      return (this->Features).L1CacheSize;
    }
  }
  return iVar1;
}

Assistant:

int SystemInformationImplementation::GetProcessorCacheXSize(long int dwCacheID)
{
  switch (dwCacheID)
    {
    case L1CACHE_FEATURE:
      return this->Features.L1CacheSize;
    case L2CACHE_FEATURE:
      return this->Features.L2CacheSize;
    case L3CACHE_FEATURE:
      return this->Features.L3CacheSize;
    }
  return -1;
}